

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMateGeneric::IntFromDescriptor
          (ChLinkMateGeneric *this,uint off_v,ChStateDelta *v,uint off_L,ChVectorDynamic<> *L)

{
  double dVar1;
  ChConstraintTwoBodies *pCVar2;
  Scalar *pSVar3;
  int i;
  int i_00;
  int iVar4;
  
  iVar4 = 0;
  for (i_00 = 0; i_00 < (this->mask).nconstr; i_00 = i_00 + 1) {
    pCVar2 = ChLinkMask::Constr_N(&this->mask,i_00);
    if ((pCVar2->super_ChConstraintTwo).super_ChConstraint.active == true) {
      pCVar2 = ChLinkMask::Constr_N(&this->mask,i_00);
      dVar1 = (pCVar2->super_ChConstraintTwo).super_ChConstraint.l_i;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                          (ulong)(iVar4 + off_L));
      iVar4 = iVar4 + 1;
      *pSVar3 = dVar1;
    }
  }
  return;
}

Assistant:

void ChLinkMateGeneric::IntFromDescriptor(const unsigned int off_v,
                                          ChStateDelta& v,
                                          const unsigned int off_L,
                                          ChVectorDynamic<>& L) {
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            L(off_L + cnt) = mask.Constr_N(i).Get_l_i();
            cnt++;
        }
    }
}